

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_4> *extraout_RDX;
  Matrix<float,_3,_4> *extraout_RDX_00;
  Matrix<float,_3,_4> *mat;
  Matrix<float,_3,_4> *mat_00;
  Type in0;
  MatrixCaseUtils local_ec [12];
  MatrixCaseUtils local_e0 [12];
  tcu local_d4 [12];
  Mat4x3 local_c8;
  VecAccess<float,_4,_3> local_98;
  Matrix<float,_3,_4> local_80;
  Matrix<float,_3,_4> local_50;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,12>(&local_c8,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_3,_4>::Matrix(&local_c8,(float *)s_constInMat4x3);
    mat = extraout_RDX_00;
  }
  decrement<float,3,4>(&local_50,(MatrixCaseUtils *)&local_c8,mat);
  reduceToVec3(local_e0,&local_50);
  decrement<float,3,4>(&local_80,(MatrixCaseUtils *)&local_c8,mat_00);
  reduceToVec3(local_ec,&local_80);
  tcu::operator+(local_d4,(Vector<float,_3> *)local_e0,(Vector<float,_3> *)local_ec);
  local_98.m_vector = &evalCtx->color;
  local_98.m_index[0] = 0;
  local_98.m_index[1] = 1;
  local_98.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_98,(Vector<float,_3> *)local_d4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}